

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_vertex_color(void *attr,float *vals,nk_draw_vertex_layout_format format)

{
  float *c;
  uint in_EDX;
  float *in_RSI;
  void *in_RDI;
  nk_uint color;
  nk_color col_7;
  double col_6 [4];
  nk_uint col_5 [4];
  nk_uint col_4 [3];
  nk_ushort col_3 [4];
  nk_ushort col_2 [3];
  nk_color bgra;
  nk_color col_1;
  nk_color col;
  float val [4];
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  nk_uint local_90;
  nk_color local_8c;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined2 local_42;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined2 local_38;
  undefined2 local_36;
  nk_color local_34;
  nk_color local_30;
  nk_color local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  void *local_8;
  
  if ((7 < in_EDX) && (in_EDX < 0x13)) {
    if (*in_RSI <= 1.0) {
      local_94 = *in_RSI;
    }
    else {
      local_94 = 1.0;
    }
    if (local_94 <= 0.0) {
      local_9c = 0.0;
    }
    else {
      if (*in_RSI <= 1.0) {
        local_98 = *in_RSI;
      }
      else {
        local_98 = 1.0;
      }
      local_9c = local_98;
    }
    local_28 = local_9c;
    if (in_RSI[1] <= 1.0) {
      local_a0 = in_RSI[1];
    }
    else {
      local_a0 = 1.0;
    }
    if (local_a0 <= 0.0) {
      local_a8 = 0.0;
    }
    else {
      if (in_RSI[1] <= 1.0) {
        local_a4 = in_RSI[1];
      }
      else {
        local_a4 = 1.0;
      }
      local_a8 = local_a4;
    }
    local_24 = local_a8;
    if (in_RSI[2] <= 1.0) {
      local_ac = in_RSI[2];
    }
    else {
      local_ac = 1.0;
    }
    if (local_ac <= 0.0) {
      local_b4 = 0.0;
    }
    else {
      if (in_RSI[2] <= 1.0) {
        local_b0 = in_RSI[2];
      }
      else {
        local_b0 = 1.0;
      }
      local_b4 = local_b0;
    }
    local_20 = local_b4;
    if (in_RSI[3] <= 1.0) {
      local_b8 = in_RSI[3];
    }
    else {
      local_b8 = 1.0;
    }
    if (local_b8 <= 0.0) {
      local_c0 = 0.0;
    }
    else {
      if (in_RSI[3] <= 1.0) {
        local_bc = in_RSI[3];
      }
      else {
        local_bc = 1.0;
      }
      local_c0 = local_bc;
    }
    local_1c = local_c0;
    c = (float *)(ulong)(in_EDX - 8);
    local_8 = in_RDI;
    switch(c) {
    case (float *)0x0:
    case (float *)0x3:
      local_2c = nk_rgba_fv(c);
      nk_memcopy(local_8,&local_2c,4);
      break;
    case (float *)0x1:
      local_3a = (undefined2)(int)(local_9c * 65535.0);
      local_38 = (undefined2)(int)(local_a8 * 65535.0);
      local_36 = (undefined2)(int)(local_b4 * 65535.0);
      nk_memcopy(in_RDI,&local_3a,6);
      break;
    case (float *)0x2:
      local_50 = (undefined4)(long)(local_9c * 4.2949673e+09);
      local_4c = (undefined4)(long)(local_a8 * 4.2949673e+09);
      local_48 = (undefined4)(long)(local_b4 * 4.2949673e+09);
      nk_memcopy(in_RDI,&local_50,0xc);
      break;
    case (float *)0x4:
      local_30 = nk_rgba_fv(c);
      local_34 = nk_rgba((uint)local_30 >> 0x10 & 0xff,(uint)local_30 >> 8 & 0xff,
                         (uint)local_30 & 0xff,(uint)local_30 >> 0x18);
      nk_memcopy(local_8,&local_34,4);
      break;
    case (float *)0x5:
      local_42 = (undefined2)(int)(local_9c * 65535.0);
      local_40 = (undefined2)(int)(local_a8 * 65535.0);
      local_3e = (undefined2)(int)(local_b4 * 65535.0);
      local_3c = (undefined2)(int)(local_c0 * 65535.0);
      nk_memcopy(in_RDI,&local_42,8);
      break;
    case (float *)0x6:
      local_68 = (undefined4)(long)(local_9c * 4.2949673e+09);
      local_64 = (undefined4)(long)(local_a8 * 4.2949673e+09);
      local_60 = (undefined4)(long)(local_b4 * 4.2949673e+09);
      local_5c = (undefined4)(long)(local_c0 * 4.2949673e+09);
      nk_memcopy(in_RDI,&local_68,0x10);
      break;
    case (float *)0x7:
      nk_memcopy(in_RDI,&local_28,0x10);
      break;
    case (float *)0x8:
      local_88 = (double)local_9c;
      local_80 = (double)local_a8;
      local_78 = (double)local_b4;
      local_70 = (double)local_c0;
      nk_memcopy(in_RDI,&local_88,0x20);
      break;
    case (float *)0x9:
    case (float *)0xa:
      local_8c = nk_rgba_fv(c);
      local_90 = nk_color_u32(local_8c);
      nk_memcopy(local_8,&local_90,4);
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_draw_vertex_color(void *attr, const float *vals,
enum nk_draw_vertex_layout_format format)
{
/* if this triggers you tried to provide a value format for a color */
float val[4];
NK_ASSERT(format >= NK_FORMAT_COLOR_BEGIN);
NK_ASSERT(format <= NK_FORMAT_COLOR_END);
if (format < NK_FORMAT_COLOR_BEGIN || format > NK_FORMAT_COLOR_END) return;

val[0] = NK_SATURATE(vals[0]);
val[1] = NK_SATURATE(vals[1]);
val[2] = NK_SATURATE(vals[2]);
val[3] = NK_SATURATE(vals[3]);

switch (format) {
default: NK_ASSERT(0 && "Invalid vertex layout color format"); break;
case NK_FORMAT_R8G8B8A8:
case NK_FORMAT_R8G8B8: {
struct nk_color col = nk_rgba_fv(val);
NK_MEMCPY(attr, &col.r, sizeof(col));
} break;
case NK_FORMAT_B8G8R8A8: {
struct nk_color col = nk_rgba_fv(val);
struct nk_color bgra = nk_rgba(col.b, col.g, col.r, col.a);
NK_MEMCPY(attr, &bgra, sizeof(bgra));
} break;
case NK_FORMAT_R16G15B16: {
nk_ushort col[3];
col[0] = (nk_ushort)(val[0]*(float)NK_USHORT_MAX);
col[1] = (nk_ushort)(val[1]*(float)NK_USHORT_MAX);
col[2] = (nk_ushort)(val[2]*(float)NK_USHORT_MAX);
NK_MEMCPY(attr, col, sizeof(col));
} break;
case NK_FORMAT_R16G15B16A16: {
nk_ushort col[4];
col[0] = (nk_ushort)(val[0]*(float)NK_USHORT_MAX);
col[1] = (nk_ushort)(val[1]*(float)NK_USHORT_MAX);
col[2] = (nk_ushort)(val[2]*(float)NK_USHORT_MAX);
col[3] = (nk_ushort)(val[3]*(float)NK_USHORT_MAX);
NK_MEMCPY(attr, col, sizeof(col));
} break;
case NK_FORMAT_R32G32B32: {
nk_uint col[3];
col[0] = (nk_uint)(val[0]*(float)NK_UINT_MAX);
col[1] = (nk_uint)(val[1]*(float)NK_UINT_MAX);
col[2] = (nk_uint)(val[2]*(float)NK_UINT_MAX);
NK_MEMCPY(attr, col, sizeof(col));
} break;
case NK_FORMAT_R32G32B32A32: {
nk_uint col[4];
col[0] = (nk_uint)(val[0]*(float)NK_UINT_MAX);
col[1] = (nk_uint)(val[1]*(float)NK_UINT_MAX);
col[2] = (nk_uint)(val[2]*(float)NK_UINT_MAX);
col[3] = (nk_uint)(val[3]*(float)NK_UINT_MAX);
NK_MEMCPY(attr, col, sizeof(col));
} break;
case NK_FORMAT_R32G32B32A32_FLOAT:
NK_MEMCPY(attr, val, sizeof(float)*4);
break;
case NK_FORMAT_R32G32B32A32_DOUBLE: {
double col[4];
col[0] = (double)val[0];
col[1] = (double)val[1];
col[2] = (double)val[2];
col[3] = (double)val[3];
NK_MEMCPY(attr, col, sizeof(col));
} break;
case NK_FORMAT_RGB32:
case NK_FORMAT_RGBA32: {
struct nk_color col = nk_rgba_fv(val);
nk_uint color = nk_color_u32(col);
NK_MEMCPY(attr, &color, sizeof(color));
} break; }
}